

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.cc
# Opt level: O3

double lf::fe::IJacobi(uint n,double alpha,double x)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (n == 0) {
    x = -1.0;
  }
  else if (n != 1) {
    dVar5 = alpha + 2.0;
    dVar7 = alpha + 4.0;
    dVar6 = dVar5 * x + -1.0;
    dVar4 = x + x + -1.0;
    dVar5 = (((dVar7 + -2.0) * dVar7 * dVar4 + alpha * alpha) * (dVar7 + -1.0) * dVar6 +
            (dVar5 + -1.0) * -2.0 * dVar7) / (dVar5 * 4.0 * (dVar7 + -2.0));
    if (n < 3) {
      dVar7 = 1.0;
    }
    else {
      uVar1 = 6;
      dVar8 = 2.0;
      uVar2 = 3;
      do {
        dVar7 = dVar6;
        dVar6 = dVar5;
        dVar5 = (double)uVar1 + alpha;
        dVar5 = (((dVar5 + -2.0) * dVar5 * dVar4 + alpha * alpha) * (dVar5 + -1.0) * dVar6 +
                ((double)uVar2 + alpha + -1.0) * -2.0 * dVar8 * dVar5 * dVar7) /
                (((double)uVar2 + alpha) * (double)uVar1 * (dVar5 + -2.0));
        uVar1 = uVar1 + 2;
        bVar3 = uVar2 != n;
        dVar8 = dVar8 + 1.0;
        uVar2 = uVar2 + 1;
      } while (bVar3);
    }
    dVar4 = (double)(n * 2) + alpha;
    return ((alpha / (dVar4 * (dVar4 + -2.0))) * dVar6 +
           (((double)n + alpha) / (dVar4 * (dVar4 + -1.0))) * dVar5) -
           ((double)(n - 1) / ((dVar4 + -2.0) * (dVar4 + -1.0))) * dVar7;
  }
  return x;
}

Assistant:

double IJacobi(unsigned n, double alpha, double x) {
  if (n == 0) {
    return -1;
  }
  if (n == 1) {
    return x;
  }
  // Compute the n-th, (n-1)-th and (n-2)-th Jacobi Polynomial
  // This uses the same recurrence relation as the `eval` method
  double ajp1P = 2 * 2 * (2 + alpha) * (2 * 2 + alpha - 2);
  double bjp1P = 2 * 2 + alpha - 1;
  double cjp1P = (2 * 2 + alpha) * (2 * 2 + alpha - 2);
  double djp1P = 2 * (2 + alpha - 1) * (2 - 1) * (2 * 2 + alpha);
  double Pjm2 = 1;
  double Pjm1 = (2 + alpha) * x - 1;
  double Pj =
      (bjp1P * (cjp1P * (2 * x - 1) + alpha * alpha) * Pjm1 - djp1P * Pjm2) /
      ajp1P;
  for (unsigned j = 2; j < n; ++j) {
    ajp1P = 2 * (j + 1) * ((j + 1) + alpha) * (2 * (j + 1) + alpha - 2);
    bjp1P = 2 * (j + 1) + alpha - 1;
    cjp1P = (2 * (j + 1) + alpha) * (2 * (j + 1) + alpha - 2);
    djp1P = 2 * ((j + 1) + alpha - 1) * ((j + 1) - 1) * (2 * (j + 1) + alpha);
    const double Pjp1 =
        (bjp1P * (cjp1P * (2 * x - 1) + alpha * alpha) * Pj - djp1P * Pjm1) /
        ajp1P;
    Pjm2 = Pjm1;
    Pjm1 = Pj;
    Pj = Pjp1;
  }
  // Compute the integral by the formula in the docstring
  const double anL = (n + alpha) / ((2 * n + alpha - 1) * (2 * n + alpha));
  const double bnL = alpha / ((2 * n + alpha - 2) * (2 * n + alpha));
  const double cnL = (n - 1) / ((2 * n + alpha - 2) * (2 * n + alpha - 1));
  return anL * Pj + bnL * Pjm1 - cnL * Pjm2;
}